

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O1

Variant * __thiscall BamTools::Variant::operator=(Variant *this,Variant *rhs)

{
  size_t *psVar1;
  ImplBase *pIVar2;
  
  if (rhs->data != (ImplBase *)0x0) {
    psVar1 = &rhs->data->refs;
    *psVar1 = *psVar1 + 1;
  }
  pIVar2 = this->data;
  if (pIVar2 != (ImplBase *)0x0) {
    psVar1 = &pIVar2->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*pIVar2->_vptr_ImplBase[1])();
    }
  }
  this->data = rhs->data;
  return this;
}

Assistant:

Variant& operator=(const Variant& rhs)
    {
        if (rhs.data != NULL) {
            rhs.data->AddRef();
        }
        if (data != NULL) {
            data->Release();
        }
        data = rhs.data;
        return *this;
    }